

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_family.h
# Opt level: O3

void __thiscall prometheus::MetricFamily::~MetricFamily(MetricFamily *this)

{
  pointer pcVar1;
  
  std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>::~vector
            (&this->metric);
  pcVar1 = (this->help)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->help).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

struct PROMETHEUS_CPP_CORE_EXPORT MetricFamily {
  std::string name;
  std::string help;
  MetricType type = MetricType::Untyped;
  std::vector<ClientMetric> metric;
}